

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

int Abc_NodeCollapseSuppSize(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins)

{
  Abc_Obj_t *Entry;
  long lVar1;
  
  vFanins->nSize = 0;
  for (lVar1 = 0; lVar1 < (pFanout->vFanins).nSize; lVar1 = lVar1 + 1) {
    Entry = (Abc_Obj_t *)pFanout->pNtk->vObjs->pArray[(pFanout->vFanins).pArray[lVar1]];
    if (Entry != pFanin) {
      Vec_PtrPushUnique(vFanins,Entry);
    }
  }
  for (lVar1 = 0; lVar1 < (pFanin->vFanins).nSize; lVar1 = lVar1 + 1) {
    Vec_PtrPushUnique(vFanins,pFanin->pNtk->vObjs->pArray[(pFanin->vFanins).pArray[lVar1]]);
  }
  return vFanins->nSize;
}

Assistant:

int Abc_NodeCollapseSuppSize( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_PtrClear( vFanins );
    Abc_ObjForEachFanin( pFanout, pObj, i )
        if ( pObj != pFanin )
            Vec_PtrPushUnique( vFanins, pObj );
    Abc_ObjForEachFanin( pFanin, pObj, i )
        Vec_PtrPushUnique( vFanins, pObj );
    return Vec_PtrSize( vFanins );
}